

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::VertexAttributeStrideCase::test
          (VertexAttributeStrideCase *this)

{
  int local_19c;
  GLint local_198;
  int ndx;
  StridePointerData pointers [15];
  undefined1 local_28 [8];
  GLfloat vertexData [4];
  VertexAttributeStrideCase *this_local;
  
  memset(local_28,0,0x10);
  local_198 = 1;
  ndx = 0x1406;
  pointers[0].size = 0;
  pointers[0]._8_8_ = local_28;
  pointers[0].pointer._0_4_ = 1;
  pointers[0].pointer._4_4_ = 0x1406;
  pointers[1].size = 1;
  pointers[1]._8_8_ = local_28;
  pointers[1].pointer._0_4_ = 1;
  pointers[1].pointer._4_4_ = 0x1406;
  pointers[2].size = 4;
  pointers[2]._8_8_ = local_28;
  pointers[2].pointer._0_4_ = 1;
  pointers[2].pointer._4_4_ = 0x1402;
  pointers[3].size = 0;
  pointers[3]._8_8_ = local_28;
  pointers[3].pointer._0_4_ = 1;
  pointers[3].pointer._4_4_ = 0x1402;
  pointers[4].size = 1;
  pointers[4]._8_8_ = local_28;
  pointers[4].pointer._0_4_ = 1;
  pointers[4].pointer._4_4_ = 0x1402;
  pointers[5].size = 4;
  pointers[5]._8_8_ = local_28;
  pointers[5].pointer._0_4_ = 1;
  pointers[5].pointer._4_4_ = 0x140c;
  pointers[6].size = 0;
  pointers[6]._8_8_ = local_28;
  pointers[6].pointer._0_4_ = 1;
  pointers[6].pointer._4_4_ = 0x140c;
  pointers[7].size = 1;
  pointers[7]._8_8_ = local_28;
  pointers[7].pointer._0_4_ = 1;
  pointers[7].pointer._4_4_ = 0x140c;
  pointers[8].size = 4;
  pointers[8]._8_8_ = local_28;
  pointers[8].pointer._0_4_ = 1;
  pointers[8].pointer._4_4_ = 0x1400;
  pointers[9].size = 0;
  pointers[9]._8_8_ = local_28;
  pointers[9].pointer._0_4_ = 1;
  pointers[9].pointer._4_4_ = 0x1403;
  pointers[10].size = 1;
  pointers[10]._8_8_ = local_28;
  pointers[10].pointer._0_4_ = 1;
  pointers[10].pointer._4_4_ = 0x1403;
  pointers[0xb].size = 4;
  pointers[0xb]._8_8_ = local_28;
  pointers[0xb].pointer._0_4_ = 4;
  pointers[0xb].pointer._4_4_ = 0x1401;
  pointers[0xc].size = 0;
  pointers[0xc]._8_8_ = local_28;
  pointers[0xc].pointer._0_4_ = 4;
  pointers[0xc].pointer._4_4_ = 0x1401;
  pointers[0xd].size = 1;
  pointers[0xd]._8_8_ = local_28;
  pointers[0xd].pointer._0_4_ = 4;
  pointers[0xd].pointer._4_4_ = 0x1401;
  pointers[0xe].size = 4;
  pointers[0xe]._8_8_ = local_28;
  for (local_19c = 0; local_19c < 0xf; local_19c = local_19c + 1) {
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_ApiCase).super_CallLogWrapper,0,(&local_198)[(long)local_19c * 6],
               *(GLenum *)((long)&pointers[(long)local_19c + -1].pointer + 4),'\0',
               pointers[local_19c].size,*(void **)&pointers[local_19c].stride);
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       &(this->super_ApiCase).super_CallLogWrapper,0,0x8624,pointers[local_19c].size
                      );
  }
  return;
}

Assistant:

void test (void)
	{
		GLfloat vertexData[4] = {0.0f}; // never accessed

		struct StridePointerData
		{
			GLint		size;
			GLenum		type;
			GLint		stride;
			void*		pointer;
		};

		// test VertexAttribPointer
		{
			const StridePointerData pointers[] =
			{
				{ 1, GL_FLOAT,				0,	vertexData },
				{ 1, GL_FLOAT,				1,	vertexData },
				{ 1, GL_FLOAT,				4,	vertexData },
				{ 1, GL_SHORT,				0,	vertexData },
				{ 1, GL_SHORT,				1,	vertexData },
				{ 1, GL_SHORT,				4,	vertexData },
				{ 1, GL_FIXED,				0,	vertexData },
				{ 1, GL_FIXED,				1,	vertexData },
				{ 1, GL_FIXED,				4,	vertexData },
				{ 1, GL_BYTE,				0,	vertexData },
				{ 1, GL_UNSIGNED_SHORT,		1,	vertexData },
				{ 1, GL_UNSIGNED_SHORT,		4,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		0,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		1,	vertexData },
				{ 4, GL_UNSIGNED_BYTE,		4,	vertexData },
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
			{
				glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, GL_FALSE, pointers[ndx].stride, pointers[ndx].pointer);
				expectError(GL_NO_ERROR);

				verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_STRIDE, pointers[ndx].stride);
			}
		}
	}